

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_deviation(lysp_yin_ctx *ctx,lysp_deviation **deviations)

{
  size_t sVar1;
  ly_ctx *local_d0;
  char *local_c8;
  undefined1 local_b8 [8];
  yin_subelement subelems [4];
  char *p__;
  lysf_ctx fctx;
  lysp_deviation *dev;
  LY_ERR ret;
  lysp_deviation **deviations_local;
  lysp_yin_ctx *ctx_local;
  
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  memset(&p__,0,0x20);
  if (ctx == (lysp_yin_ctx *)0x0) {
    local_c8 = (char *)0x0;
  }
  else {
    local_c8 = (char *)**(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  p__ = local_c8;
  if (*deviations == (lysp_deviation *)0x0) {
    subelems[3]._16_8_ = malloc(0x30);
    if ((undefined8 *)subelems[3]._16_8_ == (undefined8 *)0x0) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_deviation");
      return LY_EMEM;
    }
    *(undefined8 *)subelems[3]._16_8_ = 1;
  }
  else {
    (*deviations)[-1].exts = (lysp_ext_instance *)((long)&((*deviations)[-1].exts)->name + 1);
    subelems[3]._16_8_ = realloc(&(*deviations)[-1].exts,(long)(*deviations)[-1].exts * 0x28 + 8);
    if ((void *)subelems[3]._16_8_ == (void *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_deviation");
      return LY_EMEM;
    }
  }
  subelems[3]._16_8_ = subelems[3]._16_8_ + 8;
  *deviations = (lysp_deviation *)subelems[3]._16_8_;
  fctx.ext_set.field_2.dnodes =
       (lyd_node **)(*deviations + (long)((long)&(*deviations)[-1].exts[-1].exts + 7));
  memset(fctx.ext_set.field_2.dnodes,0,0x28);
  dev._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((dev._4_4_ == LY_SUCCESS) &&
     (dev._4_4_ = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,(char **)fctx.ext_set.field_2.dnodes,
                                      Y_STR_ARG,LY_STMT_DEVIATION), dev._4_4_ == LY_SUCCESS)) {
    sVar1 = strlen((char *)*fctx.ext_set.field_2.dnodes);
    if (sVar1 == 0) {
      if (ctx == (lysp_yin_ctx *)0x0) {
        local_d0 = (ly_ctx *)0x0;
      }
      else {
        local_d0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_d0,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
             "deviation");
    }
    local_b8._0_4_ = LY_STMT_DESCRIPTION;
    subelems[0]._0_8_ = fctx.ext_set.field_2.dnodes + 1;
    subelems[0].dest._0_2_ = 2;
    subelems[0].flags = 0;
    subelems[0]._18_2_ = 9;
    subelems[1]._0_8_ = fctx.ext_set.field_2.dnodes + 3;
    subelems[1].dest._0_2_ = 1;
    subelems[1].flags = 0;
    subelems[1]._18_2_ = 0x27;
    subelems[2]._0_8_ = fctx.ext_set.field_2.dnodes + 2;
    subelems[2].dest._0_2_ = 2;
    memset(&subelems[2].flags,0,0x18);
    subelems[2].flags = 0;
    subelems[2]._18_2_ = 0xf;
    dev._4_4_ = yin_parse_content(ctx,(yin_subelement *)local_b8,4,fctx.ext_set.field_2.dnodes,
                                  LY_STMT_DEVIATION,(char **)0x0,
                                  (lysp_ext_instance **)(fctx.ext_set.field_2.dnodes + 4));
    if (dev._4_4_ == LY_SUCCESS) {
      dev._4_4_ = yin_unres_exts_add(ctx,(lysp_ext_instance *)fctx.ext_set.field_2.dnodes[4]);
    }
  }
  if (dev._4_4_ != LY_SUCCESS) {
    lysp_deviation_free((lysf_ctx *)&p__,(lysp_deviation *)fctx.ext_set.field_2.dnodes);
    (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
    if ((*deviations == (lysp_deviation *)0x0) ||
       ((*deviations)[-1].exts == (lysp_ext_instance *)0x0)) {
      if (*deviations != (lysp_deviation *)0x0) {
        free(&(*deviations)[-1].exts);
      }
      *deviations = (lysp_deviation *)0x0;
    }
  }
  return dev._4_4_;
}

Assistant:

static LY_ERR
yin_parse_deviation(struct lysp_yin_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_deviation *dev = NULL;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    /* create new deviation */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *deviations, dev, LY_EMEM);

    /* parse argument */
    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    LY_CHECK_GOTO(ret = yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &dev->nodeid, Y_STR_ARG, LY_STMT_DEVIATION), cleanup);
    CHECK_NONEMPTY((struct lysp_ctx *)ctx, strlen(dev->nodeid), "deviation");
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &dev->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEVIATE, &dev->deviates, YIN_SUBELEM_MANDATORY},
        {LY_STMT_REFERENCE, &dev->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), dev, LY_STMT_DEVIATION, NULL, &dev->exts);
    LY_CHECK_GOTO(ret, cleanup);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_GOTO(ret = yin_unres_exts_add(ctx, dev->exts), cleanup);

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}